

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingRenderCase::deinit
          (SamplerBindingRenderCase *this)

{
  code *pcVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_14;
  int i;
  SamplerBindingRenderCase *this_local;
  
  LayoutBindingRenderCase::deinit(&this->super_LayoutBindingRenderCase);
  local_14 = 0;
  while( true ) {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_textures);
    if ((int)sVar3 <= local_14) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_textures,(long)local_14);
    if (*pvVar4 != 0) {
      pRVar5 = gles31::Context::getRenderContext
                         ((this->super_LayoutBindingRenderCase).super_TestCase.m_context);
      iVar2 = (*pRVar5->_vptr_RenderContext[3])();
      pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x480);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_textures,(long)local_14);
      (*pcVar1)(1,pvVar4);
      pRVar5 = gles31::Context::getRenderContext
                         ((this->super_LayoutBindingRenderCase).super_TestCase.m_context);
      iVar2 = (*pRVar5->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0xb8))(this->m_textureType,0);
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void SamplerBindingRenderCase::deinit(void)
{
	LayoutBindingRenderCase::deinit();

	// Clean up texture data
	for (int i = 0; i < (int)m_textures.size(); ++i)
	{
		if (m_textures[i])
		{
			m_context.getRenderContext().getFunctions().deleteTextures(1, &m_textures[i]);
			m_context.getRenderContext().getFunctions().bindTexture(m_textureType, 0);
		}
	}
}